

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  sqlite3 *db;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar2;
  undefined4 in_register_0000000c;
  int status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 uVar3;
  allocator in_stack_ffffffffffffff37;
  string *in_stack_ffffffffffffff38;
  Logic_error *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff5c;
  
  iVar1 = sqlite3_bind_int(this->stmt_,__fd,(ulong)__addr & 0xffffffff,
                           CONCAT44(in_register_0000000c,__len));
  if (iVar1 != 0) {
    uVar3 = 1;
    db = (sqlite3 *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(in_stack_ffffffffffffff5c);
    std::operator+((char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::operator+(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            sqlite3_errmsg(this->db_);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff10);
    pcVar2 = (char *)sqlite3_sql(this->stmt_);
    iVar1 = (int)((ulong)this >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff38,pcVar2,(allocator *)&stack0xffffffffffffff37);
    Logic_error::Logic_error
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (string *)
               CONCAT17(in_stack_ffffffffffffff37,CONCAT16(uVar3,in_stack_ffffffffffffff30)),iVar1,
               db);
    __cxa_throw(db,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return iVar1;
}

Assistant:

void Connection::Stmt::bind(const int index, const int val)
    {
        int status = sqlite3_bind_int(stmt_, index, val);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding index " +
                std::to_string(index) + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }